

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O0

int glfwExtensionSupported(char *extension)

{
  int iVar1;
  GLubyte *__s1;
  char *en;
  GLint count;
  int i;
  _GLFWwindow *window;
  GLubyte *extensions;
  char *extension_local;
  
  extensions = (GLubyte *)extension;
  if (_glfwInitialized == '\0') {
    _glfwInputError(0x10001,(char *)0x0);
    extension_local._4_4_ = 0;
  }
  else {
    _count = _glfwPlatformGetCurrentContext();
    if (_count == (_GLFWwindow *)0x0) {
      _glfwInputError(0x10002,(char *)0x0);
      extension_local._4_4_ = 0;
    }
    else if ((extensions == (GLubyte *)0x0) || (*extensions == '\0')) {
      _glfwInputError(0x10004,(char *)0x0);
      extension_local._4_4_ = 0;
    }
    else {
      if (_count->glMajor < 3) {
        window = (_GLFWwindow *)glGetString(0x1f03);
        if (window == (_GLFWwindow *)0x0) {
          _glfwInputError(0x10008,"Failed to retrieve extension string");
          return 0;
        }
        iVar1 = _glfwStringInExtensionString((char *)extensions,(GLubyte *)window);
        if (iVar1 != 0) {
          return 1;
        }
      }
      else {
        glGetIntegerv(0x821d,&en);
        for (en._4_4_ = 0; (int)en._4_4_ < (int)en; en._4_4_ = en._4_4_ + 1) {
          __s1 = (*_count->GetStringi)(0x1f03,en._4_4_);
          if (__s1 == (GLubyte *)0x0) {
            _glfwInputError(0x10008,"Failed to retrieve extension string %i",(ulong)en._4_4_);
            return 0;
          }
          iVar1 = strcmp((char *)__s1,(char *)extensions);
          if (iVar1 == 0) {
            return 1;
          }
        }
      }
      extension_local._4_4_ = _glfwPlatformExtensionSupported((char *)extensions);
    }
  }
  return extension_local._4_4_;
}

Assistant:

GLFWAPI int glfwExtensionSupported(const char* extension)
{
    const GLubyte* extensions;
    _GLFWwindow* window;

    _GLFW_REQUIRE_INIT_OR_RETURN(GL_FALSE);

    window = _glfwPlatformGetCurrentContext();
    if (!window)
    {
        _glfwInputError(GLFW_NO_CURRENT_CONTEXT, NULL);
        return GL_FALSE;
    }

    if (!extension || *extension == '\0')
    {
        _glfwInputError(GLFW_INVALID_VALUE, NULL);
        return GL_FALSE;
    }

    if (window->glMajor < 3)
    {
        // Check if extension is in the old style OpenGL extensions string

        extensions = glGetString(GL_EXTENSIONS);
        if (!extensions)
        {
            _glfwInputError(GLFW_PLATFORM_ERROR,
                            "Failed to retrieve extension string");
            return GL_FALSE;
        }

        if (_glfwStringInExtensionString(extension, extensions))
            return GL_TRUE;
    }
#if defined(_GLFW_USE_OPENGL)
    else
    {
        int i;
        GLint count;

        // Check if extension is in the modern OpenGL extensions string list

        glGetIntegerv(GL_NUM_EXTENSIONS, &count);

        for (i = 0;  i < count;  i++)
        {
            const char* en = (const char*) window->GetStringi(GL_EXTENSIONS, i);
            if (!en)
            {
                _glfwInputError(GLFW_PLATFORM_ERROR,
                                "Failed to retrieve extension string %i", i);
                return GL_FALSE;
            }

            if (strcmp(en, extension) == 0)
                return GL_TRUE;
        }
    }
#endif // _GLFW_USE_OPENGL

    // Check if extension is in the platform-specific string
    return _glfwPlatformExtensionSupported(extension);
}